

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O1

void __thiscall leveldb::log::Writer::Writer(Writer *this,WritableFile *dest)

{
  uint32_t uVar1;
  int i;
  long lVar2;
  char t;
  char local_19;
  
  this->dest_ = dest;
  this->block_offset_ = 0;
  lVar2 = 0;
  do {
    local_19 = (char)lVar2;
    uVar1 = crc32c::Extend(0,&local_19,1);
    this->type_crc_[lVar2] = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

Writer::Writer(WritableFile *dest)
                : dest_(dest),
                  block_offset_(0) {
            InitTypeCrc(type_crc_);
        }